

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O0

void __thiscall
pstore::serialize::archive::database_reader::getn<pstore::gsl::span<unsigned_char,_1l>,void>
          (database_reader *this,span<unsigned_char,__1L> span)

{
  typed_address<unsigned_char> addr;
  value_type v;
  unsigned_long uVar1;
  type distance;
  pointer __first;
  pointer __result;
  pointer first;
  typed_address<unsigned_char> local_58;
  undefined1 local_50 [8];
  unique_pointer<const_unsigned_char> src;
  type size;
  unsigned_long extra_for_alignment;
  database_reader *this_local;
  span<unsigned_char,__1L> span_local;
  
  span_local.storage_.super_extent_type<_1L>.size_ = (index_type)span.storage_.data_;
  this_local = (database_reader *)span.storage_.super_extent_type<_1L>.size_;
  v = address::absolute(&this->addr_);
  uVar1 = calc_alignment<unsigned_long>(v,1);
  if (uVar1 == 0) {
    address::operator+=(&this->addr_,0);
    src._M_t.super___uniq_ptr_impl<const_unsigned_char,_void_(*)(const_unsigned_char_*)>._M_t.
    super__Tuple_impl<0UL,_const_unsigned_char_*,_void_(*)(const_unsigned_char_*)>.
    super__Head_base<0UL,_const_unsigned_char_*,_false>._M_head_impl =
         (uchar *)gsl::span<unsigned_char,_-1L>::size_bytes((span<unsigned_char,__1L> *)&this_local)
    ;
    distance = unsigned_cast<long>((long *)&src._M_t.
                                            super___uniq_ptr_impl<const_unsigned_char,_void_(*)(const_unsigned_char_*)>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_const_unsigned_char_*,_void_(*)(const_unsigned_char_*)>
                                            .super__Head_base<0UL,_const_unsigned_char_*,_false>);
    addr.a_.a_ = (address)this->db_;
    typed_address<unsigned_char>::typed_address(&local_58,(address)(this->addr_).a_);
    database::getrou<unsigned_char,void>((database *)local_50,addr,(size_t)local_58.a_.a_);
    address::operator+=(&this->addr_,distance);
    __first = std::unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)>::get
                        ((unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)> *)
                         local_50);
    __result = gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)&this_local);
    std::copy<unsigned_char_const*,unsigned_char*>(__first,__first + distance,__result);
    std::unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)>::~unique_ptr
              ((unique_ptr<const_unsigned_char,_void_(*)(const_unsigned_char_*)> *)local_50);
    return;
  }
  assert_failed("extra_for_alignment < sizeof (element_type)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0xa6);
}

Assistant:

void database_reader::getn (SpanType span) {
                using element_type = typename SpanType::element_type;

                // Adjust addr_ so that it is correctly aligned for element_type.
                auto const extra_for_alignment =
                    calc_alignment (addr_.absolute (), alignof (element_type));
                PSTORE_ASSERT (extra_for_alignment < sizeof (element_type));
                addr_ += extra_for_alignment;

                // Load the data.
                auto const size = unsigned_cast (span.size_bytes ());
                auto src = db_.getrou (typed_address<std::uint8_t> (addr_), size);
                addr_ += size;

                // Copy to the destination span.
                auto first = src.get ();
                std::copy (first, first + size, reinterpret_cast<std::uint8_t *> (span.data ()));
            }